

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O0

links_entry * find_entry(archive_entry_linkresolver *res,archive_entry *entry)

{
  dev_t dVar1;
  ulong uVar2;
  ulong uVar3;
  dev_t dVar4;
  ulong uVar5;
  archive_entry *in_RSI;
  long *in_RDI;
  int64_t ino;
  dev_t dev;
  size_t bucket;
  size_t hash;
  links_entry *le;
  archive_entry *in_stack_ffffffffffffffa8;
  links_entry *local_20;
  
  if (in_RDI[1] != 0) {
    archive_entry_free((archive_entry *)0x1155ec);
    archive_entry_free((archive_entry *)0x1155fe);
    free((void *)in_RDI[1]);
    in_RDI[1] = 0;
  }
  dVar1 = archive_entry_dev(in_stack_ffffffffffffffa8);
  uVar2 = archive_entry_ino64(in_RSI);
  uVar3 = (dVar1 ^ uVar2) & in_RDI[3] - 1U;
  local_20 = *(links_entry **)(*in_RDI + uVar3 * 8);
  while( true ) {
    if (local_20 == (links_entry *)0x0) {
      return (links_entry *)0x0;
    }
    if (((local_20->hash == (dVar1 ^ uVar2)) &&
        (dVar4 = archive_entry_dev(in_stack_ffffffffffffffa8), dVar1 == dVar4)) &&
       (uVar5 = archive_entry_ino64(local_20->canonical), uVar2 == uVar5)) break;
    local_20 = local_20->next;
  }
  local_20->links = local_20->links - 1;
  if (local_20->links != 0) {
    return local_20;
  }
  if (local_20->previous != (links_entry *)0x0) {
    local_20->previous->next = local_20->next;
  }
  if (local_20->next != (links_entry *)0x0) {
    local_20->next->previous = local_20->previous;
  }
  if (*(links_entry **)(*in_RDI + uVar3 * 8) == local_20) {
    *(links_entry **)(*in_RDI + uVar3 * 8) = local_20->next;
  }
  in_RDI[2] = in_RDI[2] + -1;
  in_RDI[1] = (long)local_20;
  return local_20;
}

Assistant:

static struct links_entry *
find_entry(struct archive_entry_linkresolver *res,
    struct archive_entry *entry)
{
	struct links_entry	*le;
	size_t			 hash, bucket;
	dev_t			 dev;
	int64_t			 ino;

	/* Free a held entry. */
	if (res->spare != NULL) {
		archive_entry_free(res->spare->canonical);
		archive_entry_free(res->spare->entry);
		free(res->spare);
		res->spare = NULL;
	}

	dev = archive_entry_dev(entry);
	ino = archive_entry_ino64(entry);
	hash = (size_t)(dev ^ ino);

	/* Try to locate this entry in the links cache. */
	bucket = hash & (res->number_buckets - 1);
	for (le = res->buckets[bucket]; le != NULL; le = le->next) {
		if (le->hash == hash
		    && dev == archive_entry_dev(le->canonical)
		    && ino == archive_entry_ino64(le->canonical)) {
			/*
			 * Decrement link count each time and release
			 * the entry if it hits zero.  This saves
			 * memory and is necessary for detecting
			 * missed links.
			 */
			--le->links;
			if (le->links > 0)
				return (le);
			/* Remove it from this hash bucket. */
			if (le->previous != NULL)
				le->previous->next = le->next;
			if (le->next != NULL)
				le->next->previous = le->previous;
			if (res->buckets[bucket] == le)
				res->buckets[bucket] = le->next;
			res->number_entries--;
			/* Defer freeing this entry. */
			res->spare = le;
			return (le);
		}
	}
	return (NULL);
}